

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O3

void __thiscall Pl_TIFFPredictor::processRow(Pl_TIFFPredictor *this)

{
  ulong uVar1;
  byte bVar2;
  byte *pbVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  Pipeline *pPVar7;
  uchar *p;
  long *plVar8;
  long lVar9;
  uint uVar10;
  longlong lVar11;
  char cVar12;
  pointer puVar13;
  uint uVar14;
  ulong uVar15;
  pointer puVar16;
  long val;
  longlong *prev;
  long *plVar17;
  byte *pbVar18;
  bool bVar19;
  BitStream in;
  BitWriter bw;
  BitStream local_70;
  BitWriter local_48;
  
  local_70.start = (uchar *)0x0;
  std::vector<long_long,_std::allocator<long_long>_>::_M_fill_assign
            (&this->previous,(ulong)this->samples_per_pixel,(value_type_conflict2 *)&local_70);
  if (this->bits_per_sample == 8) {
    puVar13 = (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar13) {
      (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar13;
    }
    pbVar18 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar16 = puVar13;
    if (pbVar18 != pbVar3) {
      puVar4 = (ulong *)(this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
      do {
        puVar5 = (ulong *)(this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        if (puVar5 != puVar4) {
          do {
            bVar2 = *pbVar18;
            uVar6 = *puVar5;
            bVar19 = this->action == a_encode;
            uVar1 = uVar6 + bVar2;
            uVar15 = uVar1;
            if (bVar19) {
              uVar15 = (ulong)bVar2;
            }
            *puVar5 = uVar15;
            cVar12 = (char)uVar1;
            if (bVar19) {
              cVar12 = bVar2 - (char)uVar6;
            }
            local_70.start = (uchar *)CONCAT71(local_70.start._1_7_,cVar12);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&this->out,(uchar *)&local_70);
            pbVar18 = pbVar18 + 1;
          } while ((puVar5 + 1 != puVar4) && (puVar5 = puVar5 + 1, pbVar18 != pbVar3));
        }
      } while (pbVar18 != pbVar3);
      puVar16 = (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar13 = (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    pPVar7 = (this->super_Pipeline).next_;
    (*pPVar7->_vptr_Pipeline[2])(pPVar7,puVar16,(long)puVar13 - (long)puVar16);
  }
  else {
    BitWriter::BitWriter(&local_48,(this->super_Pipeline).next_);
    p = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
    BitStream::BitStream
              (&local_70,p,
               (long)(this->cur_row).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)p);
    uVar10 = this->columns;
    if (uVar10 != 0) {
      uVar14 = 0;
      do {
        plVar17 = (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                  .super__Vector_impl_data._M_start;
        plVar8 = (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (plVar17 != plVar8) {
          do {
            lVar11 = BitStream::getBitsSigned(&local_70,(ulong)this->bits_per_sample);
            val = *plVar17 + lVar11;
            lVar9 = val;
            if (this->action == a_encode) {
              val = lVar11 - *plVar17;
              lVar9 = lVar11;
            }
            *plVar17 = lVar9;
            BitWriter::writeBitsSigned(&local_48,val,(ulong)this->bits_per_sample);
            plVar17 = plVar17 + 1;
          } while (plVar17 != plVar8);
          uVar10 = this->columns;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar10);
    }
    BitWriter::flush(&local_48);
  }
  return;
}

Assistant:

void
Pl_TIFFPredictor::processRow()
{
    QTC::TC("libtests", "Pl_TIFFPredictor processRow", (action == a_decode ? 0 : 1));
    previous.assign(samples_per_pixel, 0);
    if (bits_per_sample != 8) {
        BitWriter bw(next());
        BitStream in(cur_row.data(), cur_row.size());
        for (unsigned int col = 0; col < this->columns; ++col) {
            for (auto& prev: previous) {
                long long sample = in.getBitsSigned(this->bits_per_sample);
                long long new_sample = sample;
                if (action == a_encode) {
                    new_sample -= prev;
                    prev = sample;
                } else {
                    new_sample += prev;
                    prev = new_sample;
                }
                bw.writeBitsSigned(new_sample, this->bits_per_sample);
            }
        }
        bw.flush();
    } else {
        out.clear();
        auto next_it = cur_row.begin();
        auto cr_end = cur_row.end();
        auto pr_end = previous.end();

        while (next_it != cr_end) {
            for (auto prev = previous.begin(); prev != pr_end && next_it != cr_end;
                 ++prev, ++next_it) {
                long long sample = *next_it;
                long long new_sample = sample;
                if (action == a_encode) {
                    new_sample -= *prev;
                    *prev = sample;
                } else {
                    new_sample += *prev;
                    *prev = new_sample;
                }
                out.push_back(static_cast<unsigned char>(255U & new_sample));
            }
        }
        next()->write(out.data(), out.size());
    }
}